

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void add_tokens(VARR_token_t *to,VARR_token_t *from)

{
  size_t sVar1;
  token_t t;
  size_t i;
  ulong ix;
  
  ix = 0;
  while( true ) {
    sVar1 = VARR_token_tlength(from);
    if (sVar1 <= ix) break;
    t = VARR_token_tget(from,ix);
    add_token(to,t);
    ix = ix + 1;
  }
  return;
}

Assistant:

static void add_tokens (VARR (token_t) * to, VARR (token_t) * from) {
  for (size_t i = 0; i < VARR_LENGTH (token_t, from); i++)
    add_token (to, VARR_GET (token_t, from, i));
}